

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall wabt::Var::set_name(Var *this,string_view name)

{
  string local_40;
  string_view local_20;
  
  local_20.size_ = name.size_;
  local_20.data_ = name.data_;
  string_view::to_string_abi_cxx11_(&local_40,&local_20);
  set_name(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Var::set_name(string_view name) {
  set_name(name.to_string());
}